

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transpile_to_js.c
# Opt level: O0

void to_js_print_labeled_statement_tree(FILE *out,AST_Labeled_Statement *label,Program *program)

{
  Program *program_local;
  AST_Labeled_Statement *label_local;
  FILE *out_local;
  
  if (label->type != ST_LABEL) {
    print_ast_enum(out,label->type);
  }
  if (label->label != (token *)0x0) {
    fprintf((FILE *)out,"case");
    print_token(out,label->label);
  }
  fprintf((FILE *)out,":\n");
  to_js_print_ast(out,label->statement,program);
  return;
}

Assistant:

void to_js_print_labeled_statement_tree(FILE* out,struct AST_Labeled_Statement *label,struct Program *program)
{
	if(label->type!=ST_LABEL)
		print_ast_enum(out,label->type);
	if(label->label!=NULL)
	{
		fprintf(out,"case");
		print_token(out,label->label);
	}
	fprintf(out,":\n");
	to_js_print_ast(out,label->statement,program);
}